

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_undo_update_pfx_table(rtr_socket *rtr_socket,pfx_table *pfx_table,void *pdu)

{
  pdu_type type_00;
  long in_FS_OFFSET;
  int local_58;
  int rtval;
  pdu_type type;
  void *pdu_local;
  pfx_table *pfx_table_local;
  rtr_socket *rtr_socket_local;
  pfx_record pfxr;
  
  pfxr.socket = *(rtr_socket **)(in_FS_OFFSET + 0x28);
  type_00 = rtr_get_pdu_type(pdu);
  if ((type_00 != IPV4_PREFIX) && (type_00 != IPV6_PREFIX)) {
    __assert_fail("type == IPV4_PREFIX || type == IPV6_PREFIX",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x2df,
                  "int rtr_undo_update_pfx_table(struct rtr_socket *, struct pfx_table *, void *)");
  }
  rtr_prefix_pdu_2_pfx_record(rtr_socket,pdu,(pfx_record *)&rtr_socket_local,type_00);
  local_58 = -1;
  if (*(char *)((long)pdu + 8) == '\x01') {
    local_58 = pfx_table_remove(pfx_table,(pfx_record *)&rtr_socket_local);
  }
  else if (*(char *)((long)pdu + 8) == '\0') {
    local_58 = pfx_table_add(pfx_table,(pfx_record *)&rtr_socket_local);
  }
  if (*(rtr_socket **)(in_FS_OFFSET + 0x28) != pfxr.socket) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

static int rtr_undo_update_pfx_table(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table, void *pdu)
{
	const enum pdu_type type = rtr_get_pdu_type(pdu);

	assert(type == IPV4_PREFIX || type == IPV6_PREFIX);

	struct pfx_record pfxr;

	rtr_prefix_pdu_2_pfx_record(rtr_socket, pdu, &pfxr, type);

	int rtval = RTR_ERROR;
	// invert add/remove operation
	if (((struct pdu_ipv4 *)pdu)->flags == 1)
		rtval = pfx_table_remove(pfx_table, &pfxr);
	else if (((struct pdu_ipv4 *)pdu)->flags == 0)
		rtval = pfx_table_add(pfx_table, &pfxr);
	return rtval;
}